

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedCylinder.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChRoundedCylinder::ArchiveIN(ChRoundedCylinder *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChRoundedCylinder>(marchive);
  ChGeometry::ArchiveIN(&this->super_ChGeometry,marchive);
  local_30._value = &this->rad;
  local_30._name = "rad";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->hlen;
  local_48._name = "hlen";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->radsphere;
  local_60._name = "radsphere";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  return;
}

Assistant:

void ChRoundedCylinder::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChRoundedCylinder>();
    // deserialize parent class
    ChGeometry::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(rad);
    marchive >> CHNVP(hlen);
    marchive >> CHNVP(radsphere);
}